

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

error_code llvm::sys::fs::getUniqueID(Twine Path,UniqueID *Result)

{
  int StatRet;
  error_category *peVar1;
  uint uVar2;
  StringRef SVar3;
  error_code eVar4;
  SmallString<128U> PathStorage;
  stat Status_1;
  file_status local_198;
  SmallVectorImpl<char> local_150;
  undefined1 local_140 [128];
  stat local_c0;
  
  local_198.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_198.super_basic_file_status._36_8_ = 0;
  local_198.super_basic_file_status.fs_st_atime_nsec = 0;
  local_198.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_198.super_basic_file_status.fs_st_uid = 0;
  local_198.super_basic_file_status.fs_st_gid = 0;
  local_198.super_basic_file_status.fs_st_atime = 0;
  local_198.super_basic_file_status.fs_st_mtime = 0;
  local_198.super_basic_file_status.Perms = perms_not_known;
  local_198.fs_st_dev = 0;
  local_198.fs_st_nlinks = 0;
  local_198.fs_st_ino = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_140;
  SVar3 = Twine::toNullTerminatedStringRef(&Path,&local_150);
  StatRet = stat(SVar3.Data,(stat *)&local_c0);
  eVar4 = fillStatus(StatRet,&local_c0,&local_198);
  peVar1 = eVar4._M_cat;
  uVar2 = eVar4._M_value;
  if ((undefined1 *)
      local_150.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_140) {
    free(local_150.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if (uVar2 == 0) {
    Result->Device = local_198.fs_st_dev;
    Result->File = local_198.fs_st_ino;
    uVar2 = 0;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  eVar4._4_4_ = 0;
  eVar4._M_value = uVar2;
  eVar4._M_cat = peVar1;
  return eVar4;
}

Assistant:

std::error_code getUniqueID(const Twine Path, UniqueID &Result) {
  file_status Status;
  std::error_code EC = status(Path, Status);
  if (EC)
    return EC;
  Result = Status.getUniqueID();
  return std::error_code();
}